

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_d16_RandomValues_Test::TestBody
          (BlendA64MaskTest8B_d16_RandomValues_Test *this)

{
  ACMRandom *this_00;
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int bsize;
  int block_size;
  long lVar5;
  
  this_00 = &(this->super_BlendA64MaskTest8B_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*)>
             .rng_;
  block_size = 0;
  while( true ) {
    if (block_size == 0x16) {
      return;
    }
    bVar1 = testing::Test::HasFatalFailure();
    if (bVar1) break;
    for (lVar5 = 0x14020; lVar5 != 0x28020; lVar5 = lVar5 + 1) {
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar5 + -0x13fe8) = uVar2;
      uVar2 = libaom_test::ACMRandom::Rand8(this_00);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .dst_ref_[lVar5 + -0x20] = uVar2;
      uVar3 = libaom_test::ACMRandom::Rand16(this_00);
      *(uint16_t *)
       ((this->super_BlendA64MaskTest8B_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
        .dst_ref_ + lVar5 * 2 + -0x38) = uVar3 & 0x3fff;
      uVar3 = libaom_test::ACMRandom::Rand16(this_00);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .src0_[lVar5 + -0x1c] = uVar3 & 0x3fff;
    }
    for (lVar5 = 0x78050; lVar5 != 0x88050; lVar5 = lVar5 + 1) {
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x41);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .dst_ref_[lVar5 + -0x38] = (uchar)uVar4;
    }
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
               *)this,block_size,1);
    block_size = block_size + 1;
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand16() & kSrcMaxBitsMask;
      src1_[i] = rng_.Rand16() & kSrcMaxBitsMask;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, 1);
  }
}